

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O2

pair<tyti::stl::basic_solid<float>,_bool> *
tyti::stl::read<float>
          (pair<tyti::stl::basic_solid<float>,_bool> *__return_storage_ptr__,string *fileName)

{
  bool bVar1;
  basic_solid<float> out;
  basic_solid<float> local_80;
  
  local_80.header._M_dataplus._M_p = (pointer)&local_80.header.field_2;
  local_80.header._M_string_length = 0;
  local_80.header.field_2._M_local_buf[0] = '\0';
  local_80.normals.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.normals.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.normals.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.vertices.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.vertices.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.vertices.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = read<float>(&local_80,fileName);
  basic_solid<float>::basic_solid(&__return_storage_ptr__->first,&local_80);
  __return_storage_ptr__->second = bVar1;
  basic_solid<float>::~basic_solid(&local_80);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<basic_solid<T>, bool> read(const std::string& fileName)
        {
            basic_solid<T> out;
            bool r = read(out, fileName);
            return std::make_pair<basic_solid<T>, bool>(std::move(out), std::move(r));
        }